

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

void __thiscall ctemplate::TemplateCache::DoneWithGetTemplatePtrs(TemplateCache *this)

{
  Mutex *this_00;
  __node_base *p_Var1;
  
  this_00 = this->mutex_;
  Mutex::Lock(this_00);
  p_Var1 = &(this->get_template_calls_->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    RefcountedTemplate::DecRefN
              ((RefcountedTemplate *)p_Var1[1]._M_nxt,
               (int)((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor);
  }
  std::
  _Hashtable<ctemplate::TemplateCache::RefcountedTemplate_*,_std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_ctemplate::TemplateCache::RefTplPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&this->get_template_calls_->_M_h);
  Mutex::Unlock(this_00);
  return;
}

Assistant:

void TemplateCache::DoneWithGetTemplatePtrs() {
  WriterMutexLock ml(mutex_);
  for (TemplateCallMap::iterator it = get_template_calls_->begin();
       it != get_template_calls_->end(); ++it) {
    it->first->DecRefN(it->second);  // it.second: # of times GetTpl was called
  }
  get_template_calls_->clear();
}